

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

uint32_t * parasail_reverse_uint32_t(uint32_t *s,size_t length)

{
  long lVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  
  puVar2 = (uint32_t *)malloc(length * 4);
  if (puVar2 == (uint32_t *)0x0) {
    fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_reverse_uint32_t",length * 4);
  }
  else {
    puVar3 = puVar2;
    if (length != 0) {
      do {
        lVar1 = length - 1;
        length = length - 1;
        *puVar3 = s[lVar1];
        puVar3 = puVar3 + 1;
      } while (length != 0);
    }
  }
  return puVar2;
}

Assistant:

uint32_t* parasail_reverse_uint32_t(const uint32_t *s, size_t length)
{
    uint32_t *r = NULL;
    size_t i = 0;
    size_t j = 0;

    PARASAIL_CALLOC(r, uint32_t, length);
    for (i=0,j=length-1; i<length; ++i,--j) {
        r[i] = s[j];
    }

    return r;
}